

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::EntityType::ReadFromTokenisedString
          (EntityType *this,KString *String,KString *Seperator)

{
  char *pcVar1;
  char *__delim;
  size_type sVar2;
  KException *this_00;
  reference pvVar3;
  allocator<char> local_99;
  KString local_98;
  value_type_conflict2 local_66;
  int local_64;
  char *pcStack_60;
  int i;
  KCHAR8 *token;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vValues;
  KString sCopy;
  KString *Seperator_local;
  KString *String_local;
  EntityType *this_local;
  
  std::__cxx11::string::string
            ((string *)
             &vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(string *)String);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&token);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  __delim = (char *)std::__cxx11::string::c_str();
  pcStack_60 = strtok(pcVar1,__delim);
  while (pcStack_60 != (char *)0x0) {
    local_64 = atoi(pcStack_60);
    if (local_64 < 0) {
      local_64 = 0;
    }
    local_66 = (value_type_conflict2)local_64;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&token,&local_66);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pcStack_60 = strtok((char *)0x0,pcVar1);
  }
  sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&token);
  if (sVar2 != 7) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"ReadFromTokenisedString",&local_99);
    KException::KException<char_const*>
              (this_00,&local_98,8,"Token String Must Contain 7 Integer Values Only.");
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&token,0);
  this->m_ui8EntityKind = (KUINT8)*pvVar3;
  pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&token,1);
  this->m_ui8Domain = (KUINT8)*pvVar3;
  pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&token,2);
  this->m_ui16Country = *pvVar3;
  pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&token,3);
  this->m_ui8Category = (KUINT8)*pvVar3;
  pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&token,4);
  this->m_ui8SubCategory = (KUINT8)*pvVar3;
  pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&token,5);
  this->m_ui8Specific = (KUINT8)*pvVar3;
  pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&token,6);
  this->m_ui8Extra = (KUINT8)*pvVar3;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&token);
  std::__cxx11::string::~string
            ((string *)
             &vValues.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void EntityType::ReadFromTokenisedString(const KString &String, const KString &Seperator /*= ","*/ ) noexcept(false)
{
    // Copy the string, we don't want to change the string we have been passed.
    KString sCopy = String;

    vector<KUINT16> vValues;

    KCHAR8 * token = strtok( ( KCHAR8 * )sCopy.c_str(), Seperator.c_str() );

    while (token != nullptr)
    {
        auto i = atoi(token);
        if( i < 0 ) i = 0; // If the value is less than 0 then we need to make it 0.

        vValues.push_back(static_cast<unsigned short>(i));

        // Get next token:
        token = strtok(nullptr, Seperator.c_str());
    }

    // We need 7 values in total, if not we have a problem.
    if( vValues.size() != 7 )
    {
        throw KException( __FUNCTION__, INVALID_DATA, "Token String Must Contain 7 Integer Values Only." );
    }

    // Set the new type.
    m_ui8EntityKind = vValues[0];
    m_ui8Domain = vValues[1];
    m_ui16Country = vValues[2];
    m_ui8Category = vValues[3];
    m_ui8SubCategory = vValues[4];
    m_ui8Specific = vValues[5];
    m_ui8Extra = vValues[6];
}